

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O0

uint __thiscall duel::pickCard(duel *this,hand *hand__,bool blast)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  uint local_64;
  string local_60 [4];
  uint position;
  string temp;
  hand local_40;
  byte local_19;
  hand *phStack_18;
  bool blast_local;
  hand *hand___local;
  duel *this_local;
  
  local_19 = blast;
  phStack_18 = hand__;
  hand___local = (hand *)this;
  std::operator<<((ostream *)&std::cout,"Play a card: ");
  hand::printHand_abi_cxx11_(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string(local_60);
  local_64 = 0;
  if ((local_19 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Pick a card between ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    poVar2 = std::operator<<(poVar2," and ");
    sVar3 = std::vector<card,_std::allocator<card>_>::size(&phStack_18->hand_);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2," .");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Pick a card from your opponent\'s hand from ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    poVar2 = std::operator<<(poVar2," to ");
    sVar3 = std::vector<card,_std::allocator<card>_>::size(&phStack_18->hand_);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2," to discard.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  while( true ) {
    bVar1 = false;
    if (local_64 != 0) {
      sVar3 = std::vector<card,_std::allocator<card>_>::size(&phStack_18->hand_);
      bVar1 = local_64 <= sVar3;
    }
    if (bVar1) break;
    std::operator>>((istream *)&std::cin,local_60);
    bVar1 = is_number((string *)local_60);
    if (bVar1) {
      local_64 = std::__cxx11::stoi((string *)local_60,(size_t *)0x0,10);
    }
    if ((local_64 == 0) ||
       (sVar3 = std::vector<card,_std::allocator<card>_>::size(&phStack_18->hand_), sVar3 < local_64
       )) {
      poVar2 = std::operator<<((ostream *)&std::cout,"card must be between ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
      poVar2 = std::operator<<(poVar2," and ");
      sVar3 = std::vector<card,_std::allocator<card>_>::size(&phStack_18->hand_);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
      poVar2 = std::operator<<(poVar2," .");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  std::__cxx11::string::~string(local_60);
  return local_64 - 1;
}

Assistant:

unsigned int duel::pickCard(hand& hand__,bool blast) {
    cout << "Play a card: ";
    // list the player's hand
    hand__.printHand();
    string temp;
    unsigned int position = 0;
    if(blast) cout << "Pick a card from your opponent's hand from " << 1 << " to " << hand__.hand_.size()<< " to discard." << endl;
    else cout << "Pick a card between " << 1 << " and " << hand__.hand_.size() << " ." << endl;
    // repeats if position is out of bounds
    while (!((1 <= position) && (position <= hand__.hand_.size()))) {
        cin >> temp;
        if (is_number(temp)) position = static_cast<unsigned int>(stoi(temp));
        if (!((1 <= position) && (position <= hand__.hand_.size()))) {
            cout << "card must be between " << 1 << " and " << hand__.hand_.size() << " ." << endl;
        }
    }
    return (position-1);
}